

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O3

Vec_Str_t * Gia_ManToBridgeVec(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  Vec_Str_t *vStr;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  
  iVar6 = p->nRegs;
  if (p->vCos->nSize <= iVar6) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilBridge.c"
                  ,0x47,"Vec_Str_t *Gia_ManToBridgeVec(Gia_Man_t *)");
  }
  pGVar1 = p->pObjs;
  pGVar1->Value = 3;
  iVar9 = p->vCis->nSize;
  if ((long)iVar9 < 1) {
    uVar10 = p->nObjs;
    iVar5 = 2;
  }
  else {
    piVar2 = p->vCis->pArray;
    uVar11 = 4;
    lVar7 = 0;
    do {
      iVar5 = piVar2[lVar7];
      if (((long)iVar5 < 0) || (uVar10 = p->nObjs, (int)uVar10 <= iVar5)) goto LAB_00427844;
      pGVar1[iVar5].Value = uVar11;
      lVar7 = lVar7 + 1;
      uVar11 = uVar11 + 2;
    } while (iVar9 != lVar7);
    iVar5 = (int)lVar7 + 2;
  }
  if (0 < (int)uVar10) {
    lVar7 = 0;
    do {
      if ((~*(uint *)(&pGVar1->field_0x0 + lVar7) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(&pGVar1->field_0x0 + lVar7)) {
        if (iVar5 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        *(int *)((long)&pGVar1->Value + lVar7) = iVar5 * 2;
        iVar5 = iVar5 + 1;
      }
      lVar7 = lVar7 + 0xc;
    } while ((ulong)uVar10 * 0xc != lVar7);
  }
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar3 = (char *)malloc(1000);
  vStr->pArray = pcVar3;
  Gia_AigerWriteUnsigned(vStr,iVar9 - iVar6);
  Gia_AigerWriteUnsigned(vStr,p->nRegs);
  Gia_AigerWriteUnsigned(vStr,~(p->vCos->nSize + p->vCis->nSize) + p->nObjs);
  iVar6 = p->nObjs;
  if (0 < iVar6) {
    lVar12 = 8;
    lVar7 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(ulong *)((long)pGVar1 + lVar12 + -8);
      if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
        uVar10 = *(uint *)((long)pGVar1 +
                          lVar12 + (ulong)(uint)((int)(uVar8 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar11 = *(uint *)((long)pGVar1 +
                              lVar12 + (ulong)((uint)(uVar8 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar11 < 0)) goto LAB_00427863;
        uVar10 = uVar10 ^ (uint)(uVar8 >> 0x1d) & 1;
        uVar11 = uVar11 ^ (uint)(uVar8 >> 0x3d) & 1;
        if (uVar10 == uVar11) {
          __assert_fail("uLit0 != uLit1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilBridge.c"
                        ,0x5d,"Vec_Str_t *Gia_ManToBridgeVec(Gia_Man_t *)");
        }
        Gia_AigerWriteUnsigned(vStr,uVar10 * 2);
        Gia_AigerWriteUnsigned(vStr,uVar11);
        iVar6 = p->nObjs;
      }
      lVar7 = lVar7 + 1;
      lVar12 = lVar12 + 0xc;
    } while (lVar7 < iVar6);
  }
  iVar6 = p->nRegs;
  if (0 < iVar6) {
    iVar9 = 0;
    do {
      iVar5 = p->vCos->nSize;
      uVar10 = (iVar5 - iVar6) + iVar9;
      if (((int)uVar10 < 0) || (iVar5 <= (int)uVar10)) goto LAB_00427882;
      iVar5 = p->vCos->pArray[uVar10];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00427844;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar5;
      uVar11 = (uint)*(undefined8 *)pGVar1;
      uVar10 = pGVar1[-(ulong)(uVar11 & 0x1fffffff)].Value;
      if ((int)uVar10 < 0) goto LAB_00427863;
      Gia_AigerWriteUnsigned(vStr,(uVar11 >> 0x1d & 1 ^ uVar10) * 4 + 2);
      iVar9 = iVar9 + 1;
      iVar6 = p->nRegs;
    } while (iVar9 < iVar6);
  }
  Gia_AigerWriteUnsigned(vStr,p->vCos->nSize - iVar6);
  pVVar4 = p->vCos;
  uVar8 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar7 = 0;
    do {
      if ((int)uVar8 <= lVar7) {
LAB_00427882:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = pVVar4->pArray[lVar7];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_00427844:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return vStr;
      }
      pGVar1 = p->pObjs + iVar6;
      uVar11 = (uint)*(undefined8 *)pGVar1;
      uVar10 = pGVar1[-(ulong)(uVar11 & 0x1fffffff)].Value;
      if ((int)uVar10 < 0) {
LAB_00427863:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      Gia_AigerWriteUnsigned(vStr,uVar10 ^ uVar11 >> 0x1d & 1 ^ 1);
      lVar7 = lVar7 + 1;
      pVVar4 = p->vCos;
      uVar8 = (ulong)pVVar4->nSize;
    } while (lVar7 < (long)(uVar8 - (long)p->nRegs));
  }
  return vStr;
}

Assistant:

Vec_Str_t * Gia_ManToBridgeVec( Gia_Man_t * p )
{
    Vec_Str_t * vStr;
    Gia_Obj_t * pObj;
    int i, uLit0, uLit1, nNodes;
    assert( Gia_ManPoNum(p) > 0 );

    // start with const1 node (number 1)
    nNodes = 1;
    // assign literals(!!!) to the value field
    Gia_ManConst0(p)->Value = Abc_Var2Lit( nNodes++, 1 );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Abc_Var2Lit( nNodes++, 0 );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Abc_Var2Lit( nNodes++, 0 );

    // write header
    vStr = Vec_StrAlloc( 1000 );
    Gia_AigerWriteUnsigned( vStr, Gia_ManPiNum(p) );
    Gia_AigerWriteUnsigned( vStr, Gia_ManRegNum(p) );
    Gia_AigerWriteUnsigned( vStr, Gia_ManAndNum(p) );

    // write the nodes 
    Gia_ManForEachAnd( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        uLit1 = Gia_ObjFanin1Copy( pObj );
        assert( uLit0 != uLit1 );
        Gia_AigerWriteUnsigned( vStr, uLit0 << 1 );
        Gia_AigerWriteUnsigned( vStr, uLit1 );
    }

    // write latch drivers
    Gia_ManForEachRi( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        Gia_AigerWriteUnsigned( vStr, (uLit0 << 2) | BRIDGE_VALUE_0 );
    }

    // write PO drivers
    Gia_AigerWriteUnsigned( vStr, Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        uLit0 = Gia_ObjFanin0Copy( pObj );
        // complement property output!!!
        Gia_AigerWriteUnsigned( vStr, Abc_LitNot(uLit0) );
    }
    return vStr;
}